

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRMeshLoader.cpp
# Opt level: O1

void __thiscall
Assimp::IRRMeshImporter::InternReadFile
          (IRRMeshImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  aiColor4t<float> *paVar1;
  float *c_00;
  vector<char,_std::allocator<char>_> *pvVar2;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar3;
  pointer *ppaVar4;
  float fVar5;
  aiMesh *paVar6;
  pointer __src;
  IOStream *pIVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  IrrXMLReader *pIVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Logger *pLVar12;
  undefined4 extraout_var_03;
  char *pcVar13;
  aiMesh *paVar14;
  ulong *puVar15;
  pointer pbVar16;
  aiVector3D *paVar17;
  aiColor4D *__s;
  undefined4 extraout_var_04;
  uint *puVar18;
  aiMesh **ppaVar19;
  aiMaterial **__dest;
  aiNode *this_00;
  runtime_error *prVar20;
  long *plVar21;
  undefined1 check_comma;
  Assimp AVar22;
  byte bVar23;
  uint uVar24;
  aiFace *paVar25;
  char *pcVar26;
  long *plVar27;
  size_type __n;
  aiFace *paVar28;
  Assimp *pAVar29;
  ulong uVar30;
  pointer paVar31;
  long lVar32;
  aiVector3D *paVar33;
  IrrlichtBase *this_01;
  float fVar34;
  float fVar35;
  aiVector3D temp;
  aiMesh *curMesh;
  aiMaterial *curMat;
  uint curMatFlags;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curVertices;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> materials;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> curColors;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> meshes;
  aiColor4D c;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curUV2s;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curUVs;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curBitangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curTangents;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> curNormals;
  CIrrXML_IOStreamReader st;
  aiVector3t<float> local_218;
  uint local_20c;
  aiMesh *local_208;
  aiMaterial *local_200;
  int local_1f8;
  uint local_1f4;
  ulong local_1f0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_1e8;
  vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> local_1c8;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> local_1a8;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> local_188;
  IOStream *local_168;
  uint local_15c;
  undefined1 local_158 [8];
  undefined8 uStack_150;
  char local_148 [16];
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_138;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_118;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_f8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_d8;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> local_b8;
  aiVector3D *local_a0;
  aiColor4D *local_98;
  CIrrXML_IOStreamReader local_90;
  aiFace *local_60;
  aiMesh *local_58;
  pointer local_50;
  aiFace *local_48;
  aiVector3D *local_40;
  aiVector3D *local_38;
  
  pvVar2 = &local_90.data;
  pcVar26 = (char *)pIOHandler;
  local_90.super_IFileReadCallBack._vptr_IFileReadCallBack = (_func_int **)pvVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"rb","");
  iVar8 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,
                     local_90.super_IFileReadCallBack._vptr_IFileReadCallBack);
  local_168 = (IOStream *)CONCAT44(extraout_var,iVar8);
  if ((vector<char,_std::allocator<char>_> *)
      local_90.super_IFileReadCallBack._vptr_IFileReadCallBack != pvVar2) {
    operator_delete(local_90.super_IFileReadCallBack._vptr_IFileReadCallBack,
                    (ulong)(local_90.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start + 1));
  }
  if (local_168 == (IOStream *)0x0) {
    prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158,
                   "Failed to open IRRMESH file ",pFile);
    plVar21 = (long *)std::__cxx11::string::append(local_158);
    local_90.super_IFileReadCallBack._vptr_IFileReadCallBack = (_func_int **)*plVar21;
    plVar27 = plVar21 + 2;
    if (local_90.super_IFileReadCallBack._vptr_IFileReadCallBack == (_func_int **)plVar27) {
      local_90.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar27;
      local_90.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)plVar21[3];
      local_90.super_IFileReadCallBack._vptr_IFileReadCallBack = (_func_int **)pvVar2;
    }
    else {
      local_90.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar27;
    }
    local_90.stream = (IOStream *)plVar21[1];
    *plVar21 = (long)plVar27;
    plVar21[1] = 0;
    *(undefined1 *)(plVar21 + 2) = 0;
    std::runtime_error::runtime_error(prVar20,(string *)&local_90);
    *(undefined ***)prVar20 = &PTR__runtime_error_0082bce0;
    __cxa_throw(prVar20,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(&local_90,local_168);
  pIVar11 = irr::io::createIrrXMLReader(&local_90.super_IFileReadCallBack);
  (this->super_IrrlichtBase).reader = pIVar11;
  local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiMaterial **)0x0;
  local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_start = (aiMaterial **)0x0;
  local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiMaterial **)0x0;
  local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (aiMesh **)0x0;
  local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (aiMesh **)0x0;
  std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::reserve(&local_1c8,5);
  std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::reserve(&local_188,5);
  this_01 = &this->super_IrrlichtBase;
  local_200 = (aiMaterial *)0x0;
  local_208 = (aiMesh *)0x0;
  local_1f4 = 0;
  local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiColor4t<float> *)0x0;
  local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiColor4t<float> *)0x0;
  local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiColor4t<float> *)0x0;
  local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (aiVector3t<float> *)0x0;
  local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (aiVector3t<float> *)0x0;
  local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (aiVector3t<float> *)0x0;
  local_1f0 = 0;
  local_1f8 = 0;
  do {
    iVar8 = 0;
LAB_0044f1bd:
    while( true ) {
      iVar9 = (*this_01->reader->_vptr_IIrrXMLReader[2])();
      pIVar7 = local_168;
      if ((char)iVar9 == '\0') {
        if (local_200 != (aiMaterial *)0x0 || local_208 != (aiMesh *)0x0) {
          if (local_200 == (aiMaterial *)0x0 || local_208 == (aiMesh *)0x0) {
            pLVar12 = DefaultLogger::get();
            Logger::error(pLVar12,"IRRMESH: A buffer must contain a mesh and a material");
            releaseMaterial(&local_200);
            releaseMesh(&local_208);
          }
          else {
            if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiMaterial*,std::allocator<aiMaterial*>>::
              _M_realloc_insert<aiMaterial*const&>
                        ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_1c8,
                         (iterator)
                         local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish,&local_200);
            }
            else {
              *local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
               super__Vector_impl_data._M_finish = local_200;
              local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl
                   .super__Vector_impl_data._M_finish + 1;
            }
            if (local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                        ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_188,
                         (iterator)
                         local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_208);
            }
            else {
              *local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish = local_208;
              local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
        }
        if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_start ==
            local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_158 = (undefined1  [8])local_148;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_158,"IRRMESH: Unable to read a mesh from this file","");
          std::runtime_error::runtime_error(prVar20,(string *)local_158);
          *(undefined ***)prVar20 = &PTR__runtime_error_0082bce0;
          __cxa_throw(prVar20,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        pScene->mNumMeshes =
             (uint)((ulong)((long)local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
        ppaVar19 = (aiMesh **)
                   operator_new__((long)local_188.
                                        super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_188.
                                        super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                        _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8);
        __src = local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                super__Vector_impl_data._M_start;
        pScene->mMeshes = ppaVar19;
        if (pScene->mNumMeshes != 0) {
          uVar30 = 0;
          do {
            pScene->mMeshes[uVar30] =
                 local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar30];
            pScene->mMeshes[uVar30]->mNumUVComponents[3] = 0;
            uVar30 = uVar30 + 1;
          } while (uVar30 < pScene->mNumMeshes);
        }
        pScene->mNumMaterials =
             (uint)((ulong)((long)local_1c8.
                                  super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_1c8.
                                 super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3);
        uVar30 = (long)local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                       _M_impl.super__Vector_impl_data._M_start & 0x7fffffff8;
        __dest = (aiMaterial **)operator_new__(uVar30);
        pScene->mMaterials = __dest;
        memcpy(__dest,__src,uVar30);
        this_00 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(this_00);
        pScene->mRootNode = this_00;
        (this_00->mName).length = 9;
        builtin_strncpy((this_00->mName).data,"<IRRMesh>",10);
        uVar10 = pScene->mNumMeshes;
        this_00->mNumMeshes = uVar10;
        puVar18 = (uint *)operator_new__((ulong)uVar10 << 2);
        this_00->mMeshes = puVar18;
        if (pScene->mNumMeshes != 0) {
          uVar30 = 0;
          do {
            pScene->mRootNode->mMeshes[uVar30] = (uint)uVar30;
            uVar30 = uVar30 + 1;
          } while (uVar30 < pScene->mNumMeshes);
        }
        if (this_01->reader != (IrrXMLReader *)0x0) {
          (*this_01->reader->_vptr_IIrrXMLReader[1])();
        }
        this_01->reader = (IrrXMLReader *)0x0;
        if (local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
          operator_delete(local_138.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_138.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_138.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
          operator_delete(local_118.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_118.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiColor4t<float> *)0x0) {
          operator_delete(local_1a8.
                          super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1a8.
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1a8.
                                super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
          operator_delete(local_f8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_f8.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_f8.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
          operator_delete(local_d8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_d8.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
          operator_delete(local_b8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (aiVector3t<float> *)0x0) {
          operator_delete(local_1e8.
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1e8.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1e8.
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_start != (aiMaterial **)0x0) {
          operator_delete(local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_1c8.
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1c8.
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        local_90.super_IFileReadCallBack._vptr_IFileReadCallBack =
             (_func_int **)&PTR__CIrrXML_IOStreamReader_0082e0f8;
        if (local_90.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_90.data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_90.data.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_90.data.super__Vector_base<char,_std::allocator<char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        (*pIVar7->_vptr_IOStream[1])(pIVar7);
        return;
      }
      iVar9 = (*this_01->reader->_vptr_IIrrXMLReader[3])();
      if (iVar9 == 1) break;
      if (iVar9 == 3) {
        iVar9 = (*this_01->reader->_vptr_IIrrXMLReader[0xe])();
        pAVar29 = (Assimp *)CONCAT44(extraout_var_01,iVar9);
        if (iVar8 == 2) {
          paVar28 = local_208->mFaces;
          local_48 = paVar28 + *(uint *)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            *)&local_208->mNumFaces)->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start;
          local_50 = (pointer)local_208->mVertices;
          pbVar16 = (pointer)local_208->mNormals;
          paVar17 = local_208->mTangents;
          paVar33 = local_208->mBitangents;
          local_98 = local_208->mColors[0];
          pcVar26 = (char *)local_208->mTextureCoords[0];
          local_a0 = local_208->mTextureCoords[1];
          local_20c = 0;
          local_15c = 0;
          local_58 = (aiMesh *)pcVar26;
LAB_0045001e:
          for (; uVar30 = (ulong)(byte)*pAVar29, uVar30 < 0x21; pAVar29 = pAVar29 + 1) {
            pcVar26 = (char *)0x0;
            if ((0x100002600U >> (uVar30 & 0x3f) & 1) == 0) {
              if (uVar30 != 0) break;
              goto LAB_004503ae;
            }
          }
          if (paVar28 < local_48) {
            if (local_20c == 0) {
              paVar28->mNumIndices = 3;
              local_40 = paVar33;
              puVar18 = (uint *)operator_new__(0xc);
              paVar28->mIndices = puVar18;
              paVar33 = local_40;
            }
            AVar22 = *pAVar29;
            uVar10 = 0;
            if (0xf5 < (byte)((char)AVar22 - 0x3aU)) {
              uVar10 = 0;
              do {
                uVar10 = (uint)(byte)((char)AVar22 - 0x30) + uVar10 * 10;
                AVar22 = pAVar29[1];
                pAVar29 = pAVar29 + 1;
              } while (0xf5 < (byte)((char)AVar22 - 0x3aU));
            }
            uVar30 = ((long)local_1e8.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_1e8.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
            local_60 = paVar28;
            local_38 = paVar17;
            if (uVar30 < uVar10 || uVar30 - uVar10 == 0) {
              pLVar12 = DefaultLogger::get();
              uVar10 = 0;
              Logger::error(pLVar12,"IRRMESH: Index out of range");
            }
            local_60->mIndices[local_20c] = local_15c;
            *(float *)&local_50->_M_string_length =
                 local_1e8.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar10].z;
            (local_50->_M_dataplus)._M_p =
                 *(pointer *)
                  (local_1e8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar10);
            if (pbVar16 == (pointer)0x0) {
              pbVar16 = (pointer)0x0;
            }
            else {
              *(float *)&pbVar16->_M_string_length =
                   local_b8.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar10].z;
              (pbVar16->_M_dataplus)._M_p =
                   *(pointer *)
                    (local_b8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar10);
              pbVar16 = (pointer)((long)&pbVar16->_M_string_length + 4);
            }
            if (local_38 == (aiVector3D *)0x0) {
              paVar17 = (aiVector3D *)0x0;
            }
            else {
              local_38->z = local_d8.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].z;
              fVar34 = local_d8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar10].y;
              local_38->x = local_d8.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].x;
              local_38->y = fVar34;
              paVar17 = local_38 + 1;
            }
            if (paVar33 == (aiVector3D *)0x0) {
              paVar33 = (aiVector3D *)0x0;
            }
            else {
              paVar33->z = local_f8.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar10].z;
              fVar34 = local_f8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar10].y;
              paVar33->x = local_f8.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar10].x;
              paVar33->y = fVar34;
              paVar33 = paVar33 + 1;
            }
            if (local_98 == (aiColor4D *)0x0) {
              local_98 = (aiColor4D *)0x0;
            }
            else {
              paVar1 = local_1a8.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar10;
              fVar34 = paVar1->g;
              fVar35 = paVar1->b;
              fVar5 = paVar1->a;
              local_98->r = paVar1->r;
              local_98->g = fVar34;
              local_98->b = fVar35;
              local_98->a = fVar5;
              local_98 = local_98 + 1;
            }
            if (local_58 == (aiMesh *)0x0) {
              local_58 = (aiMesh *)0x0;
            }
            else {
              *(float *)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_58->mNumFaces)->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start =
                   local_118.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar10].z;
              fVar34 = local_118.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar10].y;
              local_58->mPrimitiveTypes =
                   (uint)local_118.
                         super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar10].x;
              local_58->mNumVertices = (uint)fVar34;
              local_58 = (aiMesh *)&local_58->field_0xc;
            }
            if (local_a0 == (aiVector3D *)0x0) {
              local_a0 = (aiVector3D *)0x0;
            }
            else {
              local_a0->z = local_138.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].z;
              fVar34 = local_138.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar10].y;
              local_a0->x = local_138.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar10].x;
              local_a0->y = fVar34;
              local_a0 = local_a0 + 1;
            }
            local_15c = local_15c + 1;
            local_50 = (pointer)((long)&local_50->_M_string_length + 4);
            uVar10 = local_20c + 1;
            pcVar26 = (char *)(ulong)uVar10;
            if (uVar10 == 3) {
              pcVar26 = (char *)(aiMesh *)0x0;
            }
            local_20c = (uint)pcVar26;
            paVar28 = local_60 + (uVar10 == 3);
            goto LAB_0045001e;
          }
          pLVar12 = DefaultLogger::get();
          Logger::error(pLVar12,"IRRMESH: Too many indices");
LAB_004503ae:
          if (paVar28 != local_48) {
            pLVar12 = DefaultLogger::get();
            Logger::error(pLVar12,"IRRMESH: Not enough indices");
          }
          iVar8 = 0;
          if (((local_1f4 & 1) != 0) && ((local_1f0 & 1) == 0)) {
            iVar8 = 0;
            pcVar26 = "$mat.opacity";
            aiMaterial::AddBinaryProperty
                      (local_200,
                       &(local_1a8.
                         super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start)->a,4,"$mat.opacity",0,0,
                       aiPTI_Float);
          }
        }
        else if (iVar8 == 1) {
LAB_0044f2a3:
          c_00 = &local_218.y;
          while( true ) {
            check_comma = SUB81(pcVar26,0);
            if (0x20 < (ulong)(byte)*pAVar29) break;
            pcVar26 = (char *)0x0;
            check_comma = false;
            if ((0x100002600U >> ((ulong)(byte)*pAVar29 & 0x3f) & 1) == 0) break;
            pAVar29 = pAVar29 + 1;
          }
          local_218.x = 0.0;
          local_218.y = 0.0;
          local_218.z = 0.0;
          local_158 = (undefined1  [8])0x0;
          uStack_150 = 0;
          for (pAVar29 = (Assimp *)
                         fast_atoreal_move<float>
                                   (pAVar29,(char *)&local_218,(float *)0x1,(bool)check_comma);
              (AVar22 = *pAVar29, AVar22 == (Assimp)0x20 || (AVar22 == (Assimp)0x9));
              pAVar29 = pAVar29 + 1) {
          }
          for (pAVar29 = (Assimp *)
                         fast_atoreal_move<float>(pAVar29,(char *)c_00,(float *)0x1,(bool)AVar22);
              (AVar22 = *pAVar29, AVar22 == (Assimp)0x20 || (AVar22 == (Assimp)0x9));
              pAVar29 = pAVar29 + 1) {
          }
          for (pAVar29 = (Assimp *)
                         fast_atoreal_move<float>
                                   (pAVar29,(char *)&local_218.z,(float *)0x1,(bool)AVar22);
              (*pAVar29 == (Assimp)0x20 || (*pAVar29 == (Assimp)0x9)); pAVar29 = pAVar29 + 1) {
          }
          if (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_1e8,
                       (iterator)
                       local_1e8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_218);
          }
          else {
            (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->z = local_218.z;
            (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->x = local_218.x;
            (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->y = local_218.y;
            local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_1e8.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          for (pAVar29 = (Assimp *)
                         fast_atoreal_move<float>
                                   (pAVar29,(char *)&local_218,(float *)0x1,(bool)AVar22);
              (AVar22 = *pAVar29, AVar22 == (Assimp)0x20 || (AVar22 == (Assimp)0x9));
              pAVar29 = pAVar29 + 1) {
          }
          for (pAVar29 = (Assimp *)
                         fast_atoreal_move<float>(pAVar29,(char *)c_00,(float *)0x1,(bool)AVar22);
              (AVar22 = *pAVar29, AVar22 == (Assimp)0x20 || (AVar22 == (Assimp)0x9));
              pAVar29 = pAVar29 + 1) {
          }
          for (pAVar29 = (Assimp *)
                         fast_atoreal_move<float>
                                   (pAVar29,(char *)&local_218.z,(float *)0x1,(bool)AVar22);
              (*pAVar29 == (Assimp)0x20 || (*pAVar29 == (Assimp)0x9)); pAVar29 = pAVar29 + 1) {
          }
          if (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
            _M_realloc_insert<aiVector3t<float>const&>
                      ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_b8,
                       (iterator)
                       local_b8.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_218);
          }
          else {
            (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->z = local_218.z;
            (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->x = local_218.x;
            (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish)->y = local_218.y;
            local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          uVar10 = 0;
          do {
            AVar22 = *pAVar29;
            if ((byte)((char)AVar22 - 0x30U) < 10) {
              uVar10 = uVar10 << 4 | (uint)(byte)((char)AVar22 - 0x30U);
            }
            else {
              bVar23 = (char)AVar22 + 0xbf;
              if ((5 < bVar23) && (bVar23 = (char)AVar22 + 0x9f, 5 < bVar23)) goto LAB_0044f46d;
              uVar10 = uVar10 * 0x10 + (uint)bVar23 + 10;
            }
            pAVar29 = pAVar29 + 1;
          } while( true );
        }
      }
    }
    iVar9 = (*this_01->reader->_vptr_IIrrXMLReader[0xd])();
    if ((char *)CONCAT44(extraout_var_00,iVar9) == (char *)0x0) {
LAB_0045077d:
      __assert_fail("__null != s1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                    ,0x8f,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
    }
    iVar9 = strcasecmp((char *)CONCAT44(extraout_var_00,iVar9),"buffer");
    if ((iVar9 == 0) && (local_200 != (aiMaterial *)0x0 || local_208 != (aiMesh *)0x0)) {
      if (local_200 == (aiMaterial *)0x0 || local_208 == (aiMesh *)0x0) {
        pLVar12 = DefaultLogger::get();
        Logger::error(pLVar12,"IRRMESH: A buffer must contain a mesh and a material");
        releaseMaterial(&local_200);
        releaseMesh(&local_208);
      }
      else {
        if (local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMaterial*,std::allocator<aiMaterial*>>::_M_realloc_insert<aiMaterial*const&>
                    ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&local_1c8,
                     (iterator)
                     local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_200);
        }
        else {
          *local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_200;
          local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1c8.super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiMesh*,std::allocator<aiMesh*>>::_M_realloc_insert<aiMesh*const&>
                    ((vector<aiMesh*,std::allocator<aiMesh*>> *)&local_188,
                     (iterator)
                     local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,&local_208);
        }
        else {
          *local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
           super__Vector_impl_data._M_finish = local_208;
          local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_188.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
      }
      local_200 = (aiMaterial *)0x0;
      local_208 = (aiMesh *)0x0;
      if (local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl
          .super__Vector_impl_data._M_start) {
        local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish =
             local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      if (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
    }
    iVar9 = (*this_01->reader->_vptr_IIrrXMLReader[0xd])();
    if ((char *)CONCAT44(extraout_var_02,iVar9) == (char *)0x0) goto LAB_0045077d;
    iVar9 = strcasecmp((char *)CONCAT44(extraout_var_02,iVar9),"material");
    if (iVar9 == 0) {
      if (local_200 != (aiMaterial *)0x0) {
        pLVar12 = DefaultLogger::get();
        Logger::warn(pLVar12,"IRRMESH: Only one material description per buffer, please");
        releaseMaterial(&local_200);
      }
      local_200 = IrrlichtBase::ParseMaterial(this_01,&local_1f4);
    }
    iVar9 = (*this_01->reader->_vptr_IIrrXMLReader[0xd])();
    if ((char *)CONCAT44(extraout_var_03,iVar9) == (char *)0x0) goto LAB_0045077d;
    iVar9 = strcasecmp((char *)CONCAT44(extraout_var_03,iVar9),"vertices");
    pcVar26 = (char *)this_01->reader->_vptr_IIrrXMLReader;
    if (iVar9 == 0) {
      iVar8 = (*(code *)((aiMesh *)pcVar26)->mColors[3])(this_01->reader,"vertexCount");
      if (iVar8 == 0) {
        pLVar12 = DefaultLogger::get();
        Logger::warn(pLVar12,"IRRMESH: Found mesh with zero vertices");
        releaseMaterial(&local_200);
        releaseMesh(&local_208);
        iVar8 = 0;
      }
      else {
        __n = (size_type)iVar8;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_1e8,__n)
        ;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_b8,__n);
        std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve(&local_1a8,__n);
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve(&local_118,__n)
        ;
        iVar8 = (*this_01->reader->_vptr_IIrrXMLReader[8])(this_01->reader,"type");
        pcVar13 = (char *)CONCAT44(extraout_var_04,iVar8);
        if (pcVar13 == (char *)0x0) {
          __assert_fail("__null != s2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/StringComparison.h"
                        ,0x90,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
        }
        iVar8 = strcasecmp("2tcoords",pcVar13);
        if (iVar8 == 0) {
          std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                    (&local_138,__n);
          if ((local_1f4 >> 0x14 & 1) == 0) {
            local_1f8 = 1;
          }
          else {
            local_158._0_4_ = 1.4013e-45;
            uVar24 = 0;
            uVar10 = 10;
            if ((local_1f4 & 2) == 0) {
              local_1f8 = 1;
              uVar10 = 6;
              if ((local_1f4 >> 8 & 1) == 0) {
                uVar10 = 1;
                uVar24 = 1;
                if ((local_1f4 >> 0x10 & 1) == 0) goto LAB_0045038d;
              }
            }
            local_1f8 = 1;
            pcVar26 = "$tex.uvwsrc";
            aiMaterial::AddBinaryProperty
                      (local_200,local_158,4,"$tex.uvwsrc",uVar10,uVar24,aiPTI_Integer);
          }
LAB_0045038d:
          iVar8 = 1;
        }
        else {
          iVar8 = strcasecmp("tangents",pcVar13);
          if (iVar8 == 0) {
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                      (&local_d8,__n);
            std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
                      (&local_f8,__n);
            iVar8 = 1;
            local_1f8 = 2;
          }
          else {
            iVar9 = strcasecmp("standard",pcVar13);
            iVar8 = 1;
            if (iVar9 == 0) {
              local_1f8 = 0;
            }
            else {
              releaseMaterial(&local_200);
              pLVar12 = DefaultLogger::get();
              Logger::warn(pLVar12,"IRRMESH: Unknown vertex format");
            }
          }
        }
      }
      goto LAB_0044f1bd;
    }
    pcVar13 = (char *)(*(code *)((aiMesh *)pcVar26)->mColors[7])();
    if (pcVar13 == (char *)0x0) goto LAB_0045077d;
    iVar9 = strcasecmp(pcVar13,"indices");
    if (iVar9 != 0) goto LAB_0044f1bd;
    if ((local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         local_1e8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish) && (local_200 != (aiMaterial *)0x0)) {
      releaseMaterial(&local_200);
      prVar20 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_158 = (undefined1  [8])local_148;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_158,"IRRMESH: indices must come after vertices","");
      std::runtime_error::runtime_error(prVar20,(string *)local_158);
      *(undefined ***)prVar20 = &PTR__runtime_error_0082bce0;
      __cxa_throw(prVar20,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar14 = (aiMesh *)operator_new(0x520);
    paVar14->mPrimitiveTypes = 0;
    paVar14->mNumVertices = 0;
    *(undefined4 *)
     &(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&paVar14->mNumFaces)->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start = 0;
    memset(&paVar14->mVertices,0,0xcc);
    paVar14->mBones = (aiBone **)0x0;
    paVar14->mMaterialIndex = 0;
    (paVar14->mName).length = 0;
    (paVar14->mName).data[0] = '\0';
    memset((paVar14->mName).data + 1,0x1b,0x3ff);
    paVar14->mNumAnimMeshes = 0;
    paVar14->mAnimMeshes = (aiAnimMesh **)0x0;
    paVar14->mMethod = 0;
    (paVar14->mAABB).mMin.x = 0.0;
    (paVar14->mAABB).mMin.y = 0.0;
    (paVar14->mAABB).mMin.z = 0.0;
    (paVar14->mAABB).mMax.x = 0.0;
    (paVar14->mAABB).mMax.y = 0.0;
    (paVar14->mAABB).mMax.z = 0.0;
    paVar14->mTextureCoords[0] = (aiVector3D *)0x0;
    paVar14->mTextureCoords[1] = (aiVector3D *)0x0;
    paVar14->mTextureCoords[2] = (aiVector3D *)0x0;
    paVar14->mTextureCoords[3] = (aiVector3D *)0x0;
    paVar14->mTextureCoords[4] = (aiVector3D *)0x0;
    paVar14->mTextureCoords[5] = (aiVector3D *)0x0;
    paVar14->mTextureCoords[6] = (aiVector3D *)0x0;
    paVar14->mTextureCoords[7] = (aiVector3D *)0x0;
    paVar14->mNumUVComponents[0] = 0;
    paVar14->mNumUVComponents[1] = 0;
    paVar14->mNumUVComponents[2] = 0;
    paVar14->mNumUVComponents[3] = 0;
    paVar14->mNumUVComponents[4] = 0;
    paVar14->mNumUVComponents[5] = 0;
    paVar14->mNumUVComponents[6] = 0;
    paVar14->mNumUVComponents[7] = 0;
    paVar14->mColors[0] = (aiColor4D *)0x0;
    paVar14->mColors[1] = (aiColor4D *)0x0;
    paVar14->mColors[2] = (aiColor4D *)0x0;
    paVar14->mColors[3] = (aiColor4D *)0x0;
    paVar14->mColors[4] = (aiColor4D *)0x0;
    paVar14->mColors[5] = (aiColor4D *)0x0;
    paVar14->mColors[6] = (aiColor4D *)0x0;
    paVar14->mColors[7] = (aiColor4D *)0x0;
    local_208 = paVar14;
    uVar10 = (*this_01->reader->_vptr_IIrrXMLReader[9])();
    local_208->mNumVertices = uVar10;
    if (local_208->mNumVertices != 0) {
      if (0x55555555 < local_208->mNumVertices * -0x55555555) {
        pLVar12 = DefaultLogger::get();
        Logger::warn(pLVar12,"IRRMESH: Number if indices isn\'t divisible by 3");
      }
      paVar14 = local_208;
      uVar10 = local_208->mNumVertices;
      uVar30 = (ulong)uVar10 / 3;
      *(uint *)&(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_208->mNumFaces)->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start = uVar10 / 3;
      puVar15 = (ulong *)operator_new__(uVar30 * 0x10 + 8);
      paVar6 = local_208;
      *puVar15 = uVar30;
      paVar28 = (aiFace *)(puVar15 + 1);
      if (2 < uVar10) {
        paVar25 = paVar28;
        do {
          paVar25->mNumIndices = 0;
          paVar25->mIndices = (uint *)0x0;
          paVar25 = paVar25 + 1;
        } while (paVar25 != paVar28 + uVar30);
      }
      paVar14->mFaces = paVar28;
      paVar14->mMaterialIndex =
           (uint)((ulong)((long)local_1c8.
                                super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_1c8.
                               super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
      paVar14->mPrimitiveTypes = 4;
      uVar30 = (ulong)local_208->mNumVertices;
      pbVar16 = (pointer)operator_new__(uVar30 * 0xc);
      if (uVar30 != 0) {
        memset(pbVar16,0,((uVar30 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
      }
      paVar6->mVertices = (aiVector3D *)pbVar16;
      lVar32 = (long)local_1e8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1e8.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      if ((long)local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_b8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start == lVar32) {
        uVar30 = (ulong)paVar6->mNumVertices;
        pbVar16 = (pointer)operator_new__(uVar30 * 0xc);
        if (uVar30 != 0) {
          memset(pbVar16,0,((uVar30 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar6->mNormals = (aiVector3D *)pbVar16;
      }
      if ((long)local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start == lVar32) {
        uVar30 = (ulong)paVar6->mNumVertices;
        paVar17 = (aiVector3D *)operator_new__(uVar30 * 0xc);
        if (uVar30 != 0) {
          memset(paVar17,0,((uVar30 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar6->mTangents = paVar17;
      }
      if ((long)local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                _M_impl.super__Vector_impl_data._M_start == lVar32) {
        uVar30 = (ulong)paVar6->mNumVertices;
        paVar17 = (aiVector3D *)operator_new__(uVar30 * 0xc);
        if (uVar30 != 0) {
          memset(paVar17,0,((uVar30 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar6->mBitangents = paVar17;
      }
      pcVar26 = (char *)((long)local_1a8.
                               super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_1a8.
                               super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4);
      if (((aiMesh *)pcVar26 == (aiMesh *)((lVar32 >> 2) * -0x5555555555555555)) &&
         ((local_1f0 & 1) != 0)) {
        uVar10 = paVar6->mNumVertices;
        uVar30 = (ulong)uVar10 << 4;
        __s = (aiColor4D *)operator_new__(uVar30);
        if ((ulong)uVar10 != 0) {
          memset(__s,0,uVar30);
        }
        paVar6->mColors[0] = __s;
      }
      if ((long)local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start == lVar32) {
        uVar30 = (ulong)paVar6->mNumVertices;
        paVar17 = (aiVector3D *)operator_new__(uVar30 * 0xc);
        if (uVar30 != 0) {
          pcVar26 = (char *)0xaaaaaaaaaaaaaaab;
          memset(paVar17,0,((uVar30 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar6->mTextureCoords[0] = paVar17;
      }
      iVar8 = 2;
      if ((long)local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                ._M_impl.super__Vector_impl_data._M_start == lVar32) {
        uVar30 = (ulong)paVar6->mNumVertices;
        paVar17 = (aiVector3D *)operator_new__(uVar30 * 0xc);
        if (uVar30 != 0) {
          pcVar26 = (char *)0xaaaaaaaaaaaaaaab;
          memset(paVar17,0,((uVar30 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar6->mTextureCoords[1] = paVar17;
      }
      goto LAB_0044f1bd;
    }
    pcVar26 = (char *)local_208;
    pLVar12 = DefaultLogger::get();
    Logger::warn(pLVar12,"IRRMESH: Found mesh with zero indices");
    releaseMesh(&local_208);
    releaseMaterial(&local_200);
  } while( true );
LAB_0044f46d:
  fVar34 = (float)(uVar10 >> 0x18) / 255.0;
  local_158._0_4_ = (float)(uVar10 >> 0x10 & 0xff) / 255.0;
  uVar24 = uVar10 >> 8 & 0xff;
  uVar30 = (ulong)uVar24;
  local_158._4_4_ = (float)uVar24 / 255.0;
  fVar35 = (float)(uVar10 & 0xff) / 255.0;
  uStack_150 = CONCAT44(fVar34,fVar35);
  if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_20c = (uint)local_1f0;
  }
  else {
    local_20c = 1;
    if (((float)local_158._0_4_ ==
         local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish[-1].r) &&
       (!NAN((float)local_158._0_4_) &&
        !NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
             _M_impl.super__Vector_impl_data._M_finish[-1].r))) {
      if (((float)local_158._4_4_ ==
           local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish[-1].g) &&
         (!NAN((float)local_158._4_4_) &&
          !NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish[-1].g))) {
        if ((fVar35 == local_1a8.
                       super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1].b) &&
           (!NAN(fVar35) &&
            !NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish[-1].b))) {
          local_20c = (uint)(byte)local_1f0;
          if (fVar34 != local_1a8.
                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].a) {
            local_20c = 1;
          }
          if (NAN(fVar34) ||
              NAN(local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].a)) {
            local_20c = 1;
          }
          uVar30 = (ulong)local_20c;
        }
      }
    }
  }
  if (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiColor4t<float>,std::allocator<aiColor4t<float>>>::
    _M_realloc_insert<aiColor4t<float>const&>
              ((vector<aiColor4t<float>,std::allocator<aiColor4t<float>>> *)&local_1a8,
               (iterator)
               local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,(aiColor4t<float> *)local_158);
  }
  else {
    (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->r = (float)local_158._0_4_;
    (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->g = (float)local_158._4_4_;
    (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->b = fVar35;
    (local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->a = fVar34;
    local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1a8.super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  for (; (*pAVar29 == (Assimp)0x20 || (*pAVar29 == (Assimp)0x9)); pAVar29 = pAVar29 + 1) {
  }
  for (pAVar29 = (Assimp *)
                 fast_atoreal_move<float>(pAVar29,(char *)&local_218,(float *)0x1,SUB81(uVar30,0));
      (AVar22 = *pAVar29, AVar22 == (Assimp)0x20 || (AVar22 == (Assimp)0x9)); pAVar29 = pAVar29 + 1)
  {
  }
  for (pAVar29 = (Assimp *)fast_atoreal_move<float>(pAVar29,(char *)c_00,(float *)0x1,(bool)AVar22);
      (*pAVar29 == (Assimp)0x20 || (*pAVar29 == (Assimp)0x9)); pAVar29 = pAVar29 + 1) {
  }
  local_218.z = 0.0;
  fVar34 = 1.0 - local_218.y;
  local_218.y = fVar34;
  if (local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
    _M_realloc_insert<aiVector3t<float>const&>
              ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_118,
               (iterator)
               local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_218);
  }
  else {
    (local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->z = 0.0;
    (local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = local_218.x;
    (local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = fVar34;
    local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_118.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (local_1f8 == 1) {
    for (pAVar29 = (Assimp *)
                   fast_atoreal_move<float>(pAVar29,(char *)&local_218,(float *)0x1,(bool)AVar22);
        (AVar22 = *pAVar29, AVar22 == (Assimp)0x20 || (AVar22 == (Assimp)0x9));
        pAVar29 = pAVar29 + 1) {
    }
    pAVar29 = (Assimp *)fast_atoreal_move<float>(pAVar29,(char *)c_00,(float *)0x1,(bool)AVar22);
    local_218.y = 1.0 - local_218.y;
    if (local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish ==
        local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_138,
                 (iterator)
                 local_138.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish,&local_218);
      goto LAB_0044f82a;
    }
    pvVar3 = &local_138;
    paVar31 = local_138.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    if (local_1f8 != 2) goto LAB_0044f82a;
    for (pAVar29 = (Assimp *)
                   fast_atoreal_move<float>(pAVar29,(char *)&local_218,(float *)0x1,(bool)AVar22);
        (AVar22 = *pAVar29, AVar22 == (Assimp)0x20 || (AVar22 == (Assimp)0x9));
        pAVar29 = pAVar29 + 1) {
    }
    for (pAVar29 = (Assimp *)
                   fast_atoreal_move<float>(pAVar29,(char *)&local_218.z,(float *)0x1,(bool)AVar22);
        (AVar22 = *pAVar29, AVar22 == (Assimp)0x20 || (AVar22 == (Assimp)0x9));
        pAVar29 = pAVar29 + 1) {
    }
    for (pAVar29 = (Assimp *)
                   fast_atoreal_move<float>(pAVar29,(char *)c_00,(float *)0x1,(bool)AVar22);
        (*pAVar29 == (Assimp)0x20 || (*pAVar29 == (Assimp)0x9)); pAVar29 = pAVar29 + 1) {
    }
    local_218._0_8_ = local_218._0_8_ ^ 0x8000000000000000;
    if (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_d8,
                 (iterator)
                 local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_218);
    }
    else {
      (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish)->z = local_218.z;
      (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish)->x = local_218.x;
      (local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish)->y = local_218.y;
      local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_d8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1;
    }
    for (pAVar29 = (Assimp *)
                   fast_atoreal_move<float>(pAVar29,(char *)&local_218,(float *)0x1,(bool)AVar22);
        (AVar22 = *pAVar29, AVar22 == (Assimp)0x20 || (AVar22 == (Assimp)0x9));
        pAVar29 = pAVar29 + 1) {
    }
    for (pAVar29 = (Assimp *)
                   fast_atoreal_move<float>(pAVar29,(char *)&local_218.z,(float *)0x1,(bool)AVar22);
        (AVar22 = *pAVar29, AVar22 == (Assimp)0x20 || (AVar22 == (Assimp)0x9));
        pAVar29 = pAVar29 + 1) {
    }
    for (pAVar29 = (Assimp *)
                   fast_atoreal_move<float>(pAVar29,(char *)c_00,(float *)0x1,(bool)AVar22);
        (*pAVar29 == (Assimp)0x20 || (*pAVar29 == (Assimp)0x9)); pAVar29 = pAVar29 + 1) {
    }
    local_218._0_8_ = local_218._0_8_ ^ 0x8000000000000000;
    if (local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<float>,std::allocator<aiVector3t<float>>>::
      _M_realloc_insert<aiVector3t<float>const&>
                ((vector<aiVector3t<float>,std::allocator<aiVector3t<float>>> *)&local_f8,
                 (iterator)
                 local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,&local_218);
      goto LAB_0044f82a;
    }
    pvVar3 = &local_f8;
    paVar31 = local_f8.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  ppaVar4 = &(pvVar3->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  paVar31->z = local_218.z;
  paVar31->x = local_218.x;
  paVar31->y = local_218.y;
  *ppaVar4 = *ppaVar4 + 1;
LAB_0044f82a:
  while ((0xd < (byte)*pAVar29 ||
         (pcVar26 = (char *)0x2401, (0x2401U >> ((byte)*pAVar29 & 0x1f) & 1) == 0))) {
    pAVar29 = pAVar29 + 1;
  }
  for (; (AVar22 = *pAVar29, AVar22 == (Assimp)0xa || (AVar22 == (Assimp)0xd));
      pAVar29 = pAVar29 + 1) {
  }
  if (AVar22 == (Assimp)0x0) goto LAB_004502ae;
  local_1f0 = (ulong)local_20c;
  goto LAB_0044f2a3;
LAB_004502ae:
  iVar8 = 0;
  local_1f0 = (ulong)local_20c;
  goto LAB_0044f1bd;
}

Assistant:

void IRRMeshImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == NULL)
        throw DeadlyImportError( "Failed to open IRRMESH file " + pFile + "");

    // Construct the irrXML parser
    CIrrXML_IOStreamReader st(file.get());
    reader = createIrrXMLReader((IFileReadCallBack*) &st);

    // final data
    std::vector<aiMaterial*> materials;
    std::vector<aiMesh*>     meshes;
    materials.reserve (5);
    meshes.reserve(5);

    // temporary data - current mesh buffer
    aiMaterial* curMat  = nullptr;
    aiMesh* curMesh     = nullptr;
    unsigned int curMatFlags = 0;

    std::vector<aiVector3D> curVertices,curNormals,curTangents,curBitangents;
    std::vector<aiColor4D>  curColors;
    std::vector<aiVector3D> curUVs,curUV2s;

    // some temporary variables
    int textMeaning = 0;
    int vertexFormat = 0; // 0 = normal; 1 = 2 tcoords, 2 = tangents
    bool useColors = false;

    // Parse the XML file
    while (reader->read())  {
        switch (reader->getNodeType())  {
        case EXN_ELEMENT:

            if (!ASSIMP_stricmp(reader->getNodeName(),"buffer") && (curMat || curMesh)) {
                // end of previous buffer. A material and a mesh should be there
                if ( !curMat || !curMesh)   {
                    ASSIMP_LOG_ERROR("IRRMESH: A buffer must contain a mesh and a material");
                    releaseMaterial( &curMat );
                    releaseMesh( &curMesh );
                } else {
                    materials.push_back(curMat);
                    meshes.push_back(curMesh);
                }
                curMat  = nullptr;
                curMesh = nullptr;

                curVertices.clear();
                curColors.clear();
                curNormals.clear();
                curUV2s.clear();
                curUVs.clear();
                curTangents.clear();
                curBitangents.clear();
            }


            if (!ASSIMP_stricmp(reader->getNodeName(),"material"))  {
                if (curMat) {
                    ASSIMP_LOG_WARN("IRRMESH: Only one material description per buffer, please");
                    releaseMaterial( &curMat );
                }
                curMat = ParseMaterial(curMatFlags);
            }
            /* no else here! */ if (!ASSIMP_stricmp(reader->getNodeName(),"vertices"))
            {
                int num = reader->getAttributeValueAsInt("vertexCount");

                if (!num)   {
                    // This is possible ... remove the mesh from the list and skip further reading
                    ASSIMP_LOG_WARN("IRRMESH: Found mesh with zero vertices");

                    releaseMaterial( &curMat );
                    releaseMesh( &curMesh );
                    textMeaning = 0;
                    continue;
                }

                curVertices.reserve(num);
                curNormals.reserve(num);
                curColors.reserve(num);
                curUVs.reserve(num);

                // Determine the file format
                const char* t = reader->getAttributeValueSafe("type");
                if (!ASSIMP_stricmp("2tcoords", t)) {
                    curUV2s.reserve (num);
                    vertexFormat = 1;

                    if (curMatFlags & AI_IRRMESH_EXTRA_2ND_TEXTURE) {
                        // *********************************************************
                        // We have a second texture! So use this UV channel
                        // for it. The 2nd texture can be either a normal
                        // texture (solid_2layer or lightmap_xxx) or a normal
                        // map (normal_..., parallax_...)
                        // *********************************************************
                        int idx = 1;
                        aiMaterial* mat = ( aiMaterial* ) curMat;

                        if (curMatFlags & AI_IRRMESH_MAT_lightmap){
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_LIGHTMAP(0));
                        }
                        else if (curMatFlags & AI_IRRMESH_MAT_normalmap_solid){
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_NORMALS(0));
                        }
                        else if (curMatFlags & AI_IRRMESH_MAT_solid_2layer) {
                            mat->AddProperty(&idx,1,AI_MATKEY_UVWSRC_DIFFUSE(1));
                        }
                    }
                }
                else if (!ASSIMP_stricmp("tangents", t))    {
                    curTangents.reserve (num);
                    curBitangents.reserve (num);
                    vertexFormat = 2;
                }
                else if (ASSIMP_stricmp("standard", t)) {
                    releaseMaterial( &curMat );
                    ASSIMP_LOG_WARN("IRRMESH: Unknown vertex format");
                }
                else vertexFormat = 0;
                textMeaning = 1;
            }
            else if (!ASSIMP_stricmp(reader->getNodeName(),"indices"))  {
                if (curVertices.empty() && curMat)  {
                    releaseMaterial( &curMat );
                    throw DeadlyImportError("IRRMESH: indices must come after vertices");
                }

                textMeaning = 2;

                // start a new mesh
                curMesh = new aiMesh();

                // allocate storage for all faces
                curMesh->mNumVertices = reader->getAttributeValueAsInt("indexCount");
                if (!curMesh->mNumVertices) {
                    // This is possible ... remove the mesh from the list and skip further reading
                    ASSIMP_LOG_WARN("IRRMESH: Found mesh with zero indices");

                    // mesh - away
                    releaseMesh( &curMesh );

                    // material - away
                    releaseMaterial( &curMat );

                    textMeaning = 0;
                    continue;
                }

                if (curMesh->mNumVertices % 3)  {
                    ASSIMP_LOG_WARN("IRRMESH: Number if indices isn't divisible by 3");
                }

                curMesh->mNumFaces = curMesh->mNumVertices / 3;
                curMesh->mFaces = new aiFace[curMesh->mNumFaces];

                // setup some members
                curMesh->mMaterialIndex = (unsigned int)materials.size();
                curMesh->mPrimitiveTypes = aiPrimitiveType_TRIANGLE;

                // allocate storage for all vertices
                curMesh->mVertices = new aiVector3D[curMesh->mNumVertices];

                if (curNormals.size() == curVertices.size())    {
                    curMesh->mNormals = new aiVector3D[curMesh->mNumVertices];
                }
                if (curTangents.size() == curVertices.size())   {
                    curMesh->mTangents = new aiVector3D[curMesh->mNumVertices];
                }
                if (curBitangents.size() == curVertices.size()) {
                    curMesh->mBitangents = new aiVector3D[curMesh->mNumVertices];
                }
                if (curColors.size() == curVertices.size() && useColors)    {
                    curMesh->mColors[0] = new aiColor4D[curMesh->mNumVertices];
                }
                if (curUVs.size() == curVertices.size())    {
                    curMesh->mTextureCoords[0] = new aiVector3D[curMesh->mNumVertices];
                }
                if (curUV2s.size() == curVertices.size())   {
                    curMesh->mTextureCoords[1] = new aiVector3D[curMesh->mNumVertices];
                }
            }
            break;

        case EXN_TEXT:
            {
            const char* sz = reader->getNodeData();
            if (textMeaning == 1)   {
                textMeaning = 0;

                // read vertices
                do  {
                    SkipSpacesAndLineEnd(&sz);
                    aiVector3D temp;aiColor4D c;

                    // Read the vertex position
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                    SkipSpaces(&sz);
                    curVertices.push_back(temp);

                    // Read the vertex normals
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                    SkipSpaces(&sz);
                    curNormals.push_back(temp);

                    // read the vertex colors
                    uint32_t clr = strtoul16(sz,&sz);
                    ColorFromARGBPacked(clr,c);

                    if (!curColors.empty() && c != *(curColors.end()-1))
                        useColors = true;

                    curColors.push_back(c);
                    SkipSpaces(&sz);


                    // read the first UV coordinate set
                    sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                    SkipSpaces(&sz);

                    sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                    SkipSpaces(&sz);
                    temp.z = 0.f;
                    temp.y = 1.f - temp.y;  // DX to OGL
                    curUVs.push_back(temp);

                    // read the (optional) second UV coordinate set
                    if (vertexFormat == 1)  {
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        temp.y = 1.f - temp.y; // DX to OGL
                        curUV2s.push_back(temp);
                    }
                    // read optional tangent and bitangent vectors
                    else if (vertexFormat == 2) {
                        // tangents
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        SkipSpaces(&sz);
                        temp.y *= -1.0f;
                        curTangents.push_back(temp);

                        // bitangents
                        sz = fast_atoreal_move<float>(sz,(float&)temp.x);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.z);
                        SkipSpaces(&sz);

                        sz = fast_atoreal_move<float>(sz,(float&)temp.y);
                        SkipSpaces(&sz);
                        temp.y *= -1.0f;
                        curBitangents.push_back(temp);
                    }
                }

                /* IMPORTANT: We assume that each vertex is specified in one
                   line. So we can skip the rest of the line - unknown vertex
                   elements are ignored.
                 */

                while (SkipLine(&sz));
            }
            else if (textMeaning == 2)  {
                textMeaning = 0;

                // read indices
                aiFace* curFace = curMesh->mFaces;
                aiFace* const faceEnd = curMesh->mFaces  + curMesh->mNumFaces;

                aiVector3D* pcV  = curMesh->mVertices;
                aiVector3D* pcN  = curMesh->mNormals;
                aiVector3D* pcT  = curMesh->mTangents;
                aiVector3D* pcB  = curMesh->mBitangents;
                aiColor4D* pcC0  = curMesh->mColors[0];
                aiVector3D* pcT0 = curMesh->mTextureCoords[0];
                aiVector3D* pcT1 = curMesh->mTextureCoords[1];

                unsigned int curIdx = 0;
                unsigned int total = 0;
                while(SkipSpacesAndLineEnd(&sz))    {
                    if (curFace >= faceEnd) {
                        ASSIMP_LOG_ERROR("IRRMESH: Too many indices");
                        break;
                    }
                    if (!curIdx)    {
                        curFace->mNumIndices = 3;
                        curFace->mIndices = new unsigned int[3];
                    }

                    unsigned int idx = strtoul10(sz,&sz);
                    if (idx >= curVertices.size())  {
                        ASSIMP_LOG_ERROR("IRRMESH: Index out of range");
                        idx = 0;
                    }

                    curFace->mIndices[curIdx] = total++;

                    *pcV++ = curVertices[idx];
                    if (pcN)*pcN++ = curNormals[idx];
                    if (pcT)*pcT++ = curTangents[idx];
                    if (pcB)*pcB++ = curBitangents[idx];
                    if (pcC0)*pcC0++ = curColors[idx];
                    if (pcT0)*pcT0++ = curUVs[idx];
                    if (pcT1)*pcT1++ = curUV2s[idx];

                    if (++curIdx == 3)  {
                        ++curFace;
                        curIdx = 0;
                    }
                }

                if (curFace != faceEnd)
                    ASSIMP_LOG_ERROR("IRRMESH: Not enough indices");

                // Finish processing the mesh - do some small material workarounds
                if (curMatFlags & AI_IRRMESH_MAT_trans_vertex_alpha && !useColors)  {
                    // Take the opacity value of the current material
                    // from the common vertex color alpha
                    aiMaterial* mat = (aiMaterial*)curMat;
                    mat->AddProperty(&curColors[0].a,1,AI_MATKEY_OPACITY);
                }
            }}
            break;

            default:
                // GCC complains here ...
                break;

        };
    }

    // End of the last buffer. A material and a mesh should be there
    if (curMat || curMesh)  {
        if ( !curMat || !curMesh)   {
            ASSIMP_LOG_ERROR("IRRMESH: A buffer must contain a mesh and a material");
            releaseMaterial( &curMat );
            releaseMesh( &curMesh );
        }
        else    {
            materials.push_back(curMat);
            meshes.push_back(curMesh);
        }
    }

    if (materials.empty())
        throw DeadlyImportError("IRRMESH: Unable to read a mesh from this file");


    // now generate the output scene
    pScene->mNumMeshes = (unsigned int)meshes.size();
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes];
    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)    {
        pScene->mMeshes[i] = meshes[i];

        // clean this value ...
        pScene->mMeshes[i]->mNumUVComponents[3] = 0;
    }

    pScene->mNumMaterials = (unsigned int)materials.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    ::memcpy(pScene->mMaterials,&materials[0],sizeof(void*)*pScene->mNumMaterials);

    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("<IRRMesh>");
    pScene->mRootNode->mNumMeshes = pScene->mNumMeshes;
    pScene->mRootNode->mMeshes = new unsigned int[pScene->mNumMeshes];

    for (unsigned int i = 0; i < pScene->mNumMeshes;++i)
        pScene->mRootNode->mMeshes[i] = i;

    // clean up and return
    delete reader;
    AI_DEBUG_INVALIDATE_PTR(reader);
}